

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makeNoteOff(MidiMessage *this)

{
  byte *pbVar1;
  
  pbVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pbVar1 != 3) || ((*pbVar1 & 0xf0) != 0x90))
     || (pbVar1[2] == 0)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
    *(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = 0x90;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[1] = '\0';
    pbVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pbVar1[2] = 0;
  return;
}

Assistant:

void MidiMessage::makeNoteOff(void) {
	if (!isNoteOn()) {
		resize(3);
		(*this)[0] = 0x90;
		(*this)[1] = 0;
		(*this)[2] = 0;
	} else {
		(*this)[2] = 0;
	}
}